

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O3

void __thiscall
OpenMD::StaticAnalyser::StaticAnalyser
          (StaticAnalyser *this,SimInfo *info,string *filename,uint nbins)

{
  pointer pcVar1;
  
  this->_vptr_StaticAnalyser = (_func_int **)&PTR__StaticAnalyser_00337820;
  this->info_ = info;
  (this->dumpFilename_)._M_dataplus._M_p = (pointer)&(this->dumpFilename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dumpFilename_,pcVar1,pcVar1 + filename->_M_string_length);
  this->step_ = 1;
  this->nBins_ = nbins;
  (this->outputFilename_)._M_dataplus._M_p = (pointer)&(this->outputFilename_).field_2;
  (this->outputFilename_)._M_string_length = 0;
  (this->outputFilename_).field_2._M_local_buf[0] = '\0';
  (this->analysisType_)._M_dataplus._M_p = (pointer)&(this->analysisType_).field_2;
  (this->analysisType_)._M_string_length = 0;
  (this->analysisType_).field_2._M_local_buf[0] = '\0';
  (this->paramString_)._M_dataplus._M_p = (pointer)&(this->paramString_).field_2;
  (this->paramString_)._M_string_length = 0;
  (this->paramString_).field_2._M_local_buf[0] = '\0';
  (this->data_).
  super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outputTypes_).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputTypes_).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputTypes_).super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

StaticAnalyser::StaticAnalyser(SimInfo* info, const std::string& filename,
                                 unsigned int nbins) :
      info_(info),
      dumpFilename_(filename), step_(1), nBins_(nbins) {}